

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

bool __thiscall
IR::MultiBranchInstr::ReplaceTarget
          (MultiBranchInstr *this,LabelInstr *oldLabelInstr,LabelInstr *newLabelInstr)

{
  RealCount *pRVar1;
  Kind KVar2;
  long *plVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  long lVar7;
  Type pSVar8;
  char *message;
  ulong uVar9;
  char *error;
  LabelInstr *pLVar10;
  uint lineNumber;
  int iVar11;
  long lVar12;
  long lVar13;
  long *plVar14;
  
  pLVar10 = (this->super_BranchInstr).m_branchTarget;
  bVar5 = (this->super_BranchInstr).m_isMultiBranch;
  if (pLVar10 == (LabelInstr *)0x0) {
    if (bVar5 == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      error = "(m_isMultiBranch)";
      message = "m_isMultiBranch";
      lineNumber = 0x20e;
      goto LAB_004bdbf5;
    }
  }
  else if (bVar5 != false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    error = "(!m_isMultiBranch)";
    message = "!m_isMultiBranch";
    lineNumber = 0x209;
LAB_004bdbf5:
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,lineNumber,error,message);
    if (!bVar5) goto LAB_004bdee7;
    *puVar6 = 0;
  }
  if (pLVar10 != (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x6ee,"(this->IsMultiBranch())","this->IsMultiBranch()");
    if (!bVar5) goto LAB_004bdee7;
    *puVar6 = 0;
  }
  plVar3 = (long *)this->m_branchTargets;
  if (plVar3 == (long *)0x0) {
    return false;
  }
  KVar2 = this->m_kind;
  if ((KVar2 == IntJumpTable) || (KVar2 == SingleCharStrJumpTable)) {
    plVar14 = plVar3 + 1;
    lVar12 = this->m_baseCaseValue;
    if (lVar12 <= this->m_lastCaseValue) {
      lVar7 = *plVar3;
      bVar5 = false;
      do {
        lVar13 = lVar7 + this->m_baseCaseValue * -8;
        pLVar10 = *(LabelInstr **)(lVar13 + lVar12 * 8);
        if (pLVar10 == oldLabelInstr) {
          if (pLVar10 != (LabelInstr *)0x0) {
            LabelInstr::RemoveLabelRef(pLVar10,&this->super_BranchInstr);
          }
          bVar5 = true;
          pLVar10 = newLabelInstr;
          if (newLabelInstr != (LabelInstr *)0x0) {
            pSVar8 = (Type)new<Memory::ArenaAllocator>
                                     (0x10,(newLabelInstr->labelRefs).
                                           super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>
                                           .allocator,0x366bee);
            pSVar8[1].next = (Type)this;
            pSVar8->next = (newLabelInstr->labelRefs).
                           super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                           super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                           super_SListNodeBase<Memory::ArenaAllocator>.next;
            (newLabelInstr->labelRefs).
            super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
            super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
            super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar8;
            pRVar1 = &(newLabelInstr->labelRefs).
                      super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                      super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                      super_RealCount;
            pRVar1->count = pRVar1->count + 1;
          }
        }
        *(LabelInstr **)(lVar13 + lVar12 * 8) = pLVar10;
        lVar12 = lVar12 + 1;
      } while (lVar12 <= this->m_lastCaseValue);
      goto LAB_004bde83;
    }
  }
  else {
    if (KVar2 != StrDictionary) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                         ,0x435,"(false)","false");
      if (!bVar5) {
LAB_004bdee7:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar6 = 0;
      bVar5 = false;
      plVar14 = (long *)0x0;
      goto LAB_004bde83;
    }
    plVar14 = plVar3 + 7;
    if (*(int *)((long)plVar3 + 0x1c) != 0) {
      bVar5 = false;
      uVar9 = 0;
      do {
        iVar11 = *(int *)(*plVar3 + uVar9 * 4);
        while (iVar11 != -1) {
          lVar12 = plVar3[1];
          lVar7 = (long)iVar11;
          iVar11 = *(int *)(lVar12 + 8 + lVar7 * 0x18);
          pLVar10 = *(LabelInstr **)(lVar12 + lVar7 * 0x18);
          if (pLVar10 == oldLabelInstr) {
            if (pLVar10 != (LabelInstr *)0x0) {
              LabelInstr::RemoveLabelRef(pLVar10,&this->super_BranchInstr);
            }
            bVar5 = true;
            pLVar10 = newLabelInstr;
            if (newLabelInstr != (LabelInstr *)0x0) {
              pSVar8 = (Type)new<Memory::ArenaAllocator>
                                       (0x10,(newLabelInstr->labelRefs).
                                             super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>
                                             .allocator,0x366bee);
              pSVar8[1].next = (Type)this;
              pSVar8->next = (newLabelInstr->labelRefs).
                             super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                             super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                             super_SListNodeBase<Memory::ArenaAllocator>.next;
              (newLabelInstr->labelRefs).
              super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
              super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
              super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar8;
              pRVar1 = &(newLabelInstr->labelRefs).
                        super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                        super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                        super_RealCount;
              pRVar1->count = pRVar1->count + 1;
            }
          }
          *(LabelInstr **)(lVar12 + lVar7 * 0x18) = pLVar10;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < *(uint *)((long)plVar3 + 0x1c));
      goto LAB_004bde83;
    }
  }
  bVar5 = false;
LAB_004bde83:
  pLVar10 = (LabelInstr *)*plVar14;
  if (pLVar10 == oldLabelInstr) {
    if (pLVar10 != (LabelInstr *)0x0) {
      LabelInstr::RemoveLabelRef(pLVar10,&this->super_BranchInstr);
    }
    bVar5 = true;
    pLVar10 = newLabelInstr;
    if (newLabelInstr != (LabelInstr *)0x0) {
      pSVar8 = (Type)new<Memory::ArenaAllocator>
                               (0x10,(newLabelInstr->labelRefs).
                                     super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>
                                     .allocator,0x366bee);
      pSVar8[1].next = (Type)this;
      pSVar8->next = (newLabelInstr->labelRefs).
                     super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                     super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                     super_SListNodeBase<Memory::ArenaAllocator>.next;
      (newLabelInstr->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar8;
      pRVar1 = &(newLabelInstr->labelRefs).
                super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                super_RealCount;
      pRVar1->count = pRVar1->count + 1;
    }
  }
  *plVar14 = (long)pLVar10;
  return bVar5;
}

Assistant:

bool
MultiBranchInstr::ReplaceTarget(IR::LabelInstr * oldLabelInstr, IR::LabelInstr * newLabelInstr)
{
    Assert(this->IsMultiBranch());
    bool remapped = false;
    this->UpdateMultiBrLabels([=, &remapped](IR::LabelInstr * targetLabel) -> IR::LabelInstr *
    {
        if (targetLabel == oldLabelInstr)
        {
            this->ChangeLabelRef(targetLabel, newLabelInstr);
            remapped = true;
            return newLabelInstr;
        }
        return targetLabel;
    });
    return remapped;
}